

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rmd256.c
# Opt level: O0

int rmd256_done(hash_state *md,uchar *out)

{
  uint uVar1;
  long in_RSI;
  long *in_RDI;
  ulong32 __t_1;
  ulong64 __t;
  int i;
  uchar *in_stack_000003b8;
  hash_state *in_stack_000003c0;
  int local_1c;
  int local_4;
  
  if (in_RDI == (long *)0x0) {
    fprintf(_stderr,"\nwarning: ARGCHK failed at %s:%d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/Cyan4973[P]smhasher/rmd256.c",0x13a);
  }
  if (in_RSI == 0) {
    fprintf(_stderr,"\nwarning: ARGCHK failed at %s:%d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/Cyan4973[P]smhasher/rmd256.c",0x13b);
  }
  if (*(uint *)(in_RDI + 9) < 0x40) {
    *in_RDI = (ulong)(uint)((int)in_RDI[9] << 3) + *in_RDI;
    uVar1 = *(uint *)(in_RDI + 9);
    *(uint *)(in_RDI + 9) = uVar1 + 1;
    *(undefined1 *)((long)in_RDI + (ulong)uVar1 + 8) = 0x80;
    if (0x38 < *(uint *)(in_RDI + 9)) {
      while (*(uint *)(in_RDI + 9) < 0x40) {
        uVar1 = *(uint *)(in_RDI + 9);
        *(uint *)(in_RDI + 9) = uVar1 + 1;
        *(undefined1 *)((long)in_RDI + (ulong)uVar1 + 8) = 0;
      }
      rmd256_compress(in_stack_000003c0,in_stack_000003b8);
      *(undefined4 *)(in_RDI + 9) = 0;
    }
    while (*(uint *)(in_RDI + 9) < 0x38) {
      uVar1 = *(uint *)(in_RDI + 9);
      *(uint *)(in_RDI + 9) = uVar1 + 1;
      *(undefined1 *)((long)in_RDI + (ulong)uVar1 + 8) = 0;
    }
    in_RDI[8] = *in_RDI;
    rmd256_compress(in_stack_000003c0,in_stack_000003b8);
    for (local_1c = 0; local_1c < 8; local_1c = local_1c + 1) {
      *(undefined4 *)(in_RSI + (local_1c << 2)) =
           *(undefined4 *)((long)in_RDI + (long)local_1c * 4 + 0x4c);
    }
    local_4 = 0;
  }
  else {
    local_4 = 0x10;
  }
  return local_4;
}

Assistant:

int rmd256_done(hash_state * md, unsigned char *out)
{
    int i;

    LTC_ARGCHK(md  != NULL);
    LTC_ARGCHK(out != NULL);

    if (md->rmd256.curlen >= sizeof(md->rmd256.buf)) {
       return CRYPT_INVALID_ARG;
    }


    /* increase the length of the message */
    md->rmd256.length += md->rmd256.curlen * 8;

    /* append the '1' bit */
    md->rmd256.buf[md->rmd256.curlen++] = (unsigned char)0x80;

    /* if the length is currently above 56 bytes we append zeros
     * then compress.  Then we can fall back to padding zeros and length
     * encoding like normal.
     */
    if (md->rmd256.curlen > 56) {
        while (md->rmd256.curlen < 64) {
            md->rmd256.buf[md->rmd256.curlen++] = (unsigned char)0;
        }
        rmd256_compress(md, md->rmd256.buf);
        md->rmd256.curlen = 0;
    }

    /* pad upto 56 bytes of zeroes */
    while (md->rmd256.curlen < 56) {
        md->rmd256.buf[md->rmd256.curlen++] = (unsigned char)0;
    }

    /* store length */
    STORE64L(md->rmd256.length, md->rmd256.buf+56);
    rmd256_compress(md, md->rmd256.buf);

    /* copy output */
    for (i = 0; i < 8; i++) {
        STORE32L(md->rmd256.state[i], out+(4*i));
    }
#ifdef LTC_CLEAN_STACK
    zeromem(md, sizeof(hash_state));
#endif
   return CRYPT_OK;
}